

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O1

bool NULLC::IsBasePointer(void *ptr)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  ulong *puVar4;
  int iVar5;
  
  lVar2 = pool16._24_8_;
  while( true ) {
    iVar5 = (int)ptr;
    if (lVar2 == 0) break;
    if ((ptr <= (long *)(lVar2 + 0x10008) && (void *)(lVar2 + 8U) <= ptr) &&
       ((iVar5 - (int)(void *)(lVar2 + 8U) & 0xfU) == 8)) break;
    lVar2 = *(long *)(lVar2 + 0x10008);
  }
  bVar1 = true;
  lVar3 = pool32._40_8_;
  if (lVar2 == 0) {
    for (; lVar3 != 0; lVar3 = *(long *)(lVar3 + 0x10008)) {
      if ((ptr <= (long *)(lVar3 + 0x10008) && (void *)(lVar3 + 8U) <= ptr) &&
         ((iVar5 - (int)(void *)(lVar3 + 8U) & 0x1fU) == 8)) break;
    }
    lVar2 = pool64._72_8_;
    if (lVar3 == 0) {
      for (; lVar2 != 0; lVar2 = *(long *)(lVar2 + 0x10008)) {
        if ((ptr <= (long *)(lVar2 + 0x10008) && (void *)(lVar2 + 8U) <= ptr) &&
           ((iVar5 - (int)(void *)(lVar2 + 8U) & 0x3fU) == 8)) break;
      }
      lVar3 = pool128._136_8_;
      if (lVar2 == 0) {
        for (; lVar3 != 0; lVar3 = *(long *)(lVar3 + 0x10008)) {
          if ((ptr <= (long *)(lVar3 + 0x10008) && (void *)(lVar3 + 8U) <= ptr) &&
             ((iVar5 - (int)(void *)(lVar3 + 8U) & 0x7fU) == 8)) break;
        }
        lVar2 = pool256._264_8_;
        if (lVar3 == 0) {
          for (; lVar2 != 0; lVar2 = *(long *)(lVar2 + 0x10008)) {
            if ((ptr <= (long *)(lVar2 + 0x10008) && (void *)(lVar2 + 8U) <= ptr) &&
               ((char)((char)ptr - (char)(void *)(lVar2 + 8U)) == '\b')) break;
          }
          lVar3 = pool512._520_8_;
          if (lVar2 == 0) {
            for (; lVar3 != 0; lVar3 = *(long *)(lVar3 + 0x10008)) {
              if ((ptr <= (long *)(lVar3 + 0x10008) && (void *)(lVar3 + 8U) <= ptr) &&
                 ((iVar5 - (int)(void *)(lVar3 + 8U) & 0x1ffU) == 8)) break;
            }
            puVar4 = (ulong *)bigBlocks._24_8_;
            if (lVar3 == 0) {
              for (; puVar4 != (ulong *)0x0;
                  puVar4 = (ulong *)puVar4[(ulong)((void *)*puVar4 <= ptr) + 2]) {
                if (((void *)*puVar4 <= ptr) && (ptr <= (void *)puVar4[1])) goto LAB_0011cc28;
              }
              puVar4 = (ulong *)0x0;
LAB_0011cc28:
              if ((puVar4 == (ulong *)0x0) || ((long)ptr - 0xcU != *puVar4)) {
                bVar1 = false;
              }
            }
          }
        }
      }
    }
  }
  return bVar1;
}

Assistant:

bool IsBasePointer(void* ptr)
	{
		MyLargeBlock *curr = activePages;
		while(curr)
		{
			if((char*)ptr >= (char*)curr->page && (char*)ptr <= (char*)curr->page + sizeof(curr->page))
			{
				if(((unsigned int)(intptr_t)((char*)ptr - (char*)curr->page) & (elemSize - 1)) == sizeof(markerType))
					return true;
			}
			curr = curr->next;
		}
		return false;
	}